

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_traits.h
# Opt level: O2

void cppcms::
     archive_traits<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_void>
     ::save(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
            *d,archive *a)

{
  archive_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::save(&d->first,a);
  archive_traits<std::vector<int,_std::allocator<int>_>,_void>::save(&d->second,a);
  return;
}

Assistant:

static void save(std::pair<F,S> const &d,archive &a)
		{
			archive_traits<F>::save(d.first,a);
			archive_traits<S>::save(d.second,a);
		}